

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachNext(sqlite3_vtab_cursor *cur)

{
  u32 i_00;
  u32 uVar1;
  uint uVar2;
  bool bVar3;
  u32 local_64;
  u32 i_1;
  u32 sz_1;
  u32 n_1;
  u32 iVal;
  JsonParent *pParent_1;
  u64 nNew;
  JsonParent *pNew;
  JsonParent *pParent;
  u32 local_30;
  u32 i;
  u32 sz;
  u32 n;
  u8 levelChange;
  u8 x;
  JsonEachCursor *pJStack_20;
  int rc;
  JsonEachCursor *p;
  sqlite3_vtab_cursor *cur_local;
  
  n = 0;
  pJStack_20 = (JsonEachCursor *)cur;
  p = (JsonEachCursor *)cur;
  if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
    local_64 = 0;
    i_00 = jsonSkipLabel((JsonEachCursor *)cur);
    uVar1 = jsonbPayloadSize(&pJStack_20->sParse,i_00,&local_64);
    pJStack_20->i = i_00 + uVar1 + local_64;
  }
  else {
    sz._2_1_ = '\0';
    local_30 = 0;
    pParent._4_4_ = jsonSkipLabel((JsonEachCursor *)cur);
    sz._3_1_ = (pJStack_20->sParse).aBlob[pParent._4_4_] & 0xf;
    i = jsonbPayloadSize(&pJStack_20->sParse,pParent._4_4_,&local_30);
    if ((sz._3_1_ == 0xc) || (sz._3_1_ == 0xb)) {
      if (pJStack_20->nParentAlloc <= pJStack_20->nParent) {
        pParent_1 = (JsonParent *)(ulong)(pJStack_20->nParentAlloc * 2 + 3);
        nNew = (u64)sqlite3DbRealloc(pJStack_20->db,pJStack_20->aParent,(long)pParent_1 * 0x18);
        if ((JsonParent *)nNew == (JsonParent *)0x0) {
          return 7;
        }
        pJStack_20->nParentAlloc = (u32)pParent_1;
        pJStack_20->aParent = (JsonParent *)nNew;
      }
      sz._2_1_ = '\x01';
      pNew = pJStack_20->aParent + pJStack_20->nParent;
      pNew->iHead = pJStack_20->i;
      pNew->iValue = pParent._4_4_;
      pNew->iEnd = pParent._4_4_ + i + local_30;
      pNew->iKey = -1;
      pNew->nPath = (u32)(pJStack_20->path).nUsed;
      if (((pJStack_20->eType != '\0') && (pJStack_20->nParent != 0)) &&
         (jsonAppendPathName(pJStack_20), (pJStack_20->path).eErr != '\0')) {
        n = 7;
      }
      pJStack_20->nParent = pJStack_20->nParent + 1;
      pJStack_20->i = pParent._4_4_ + i;
    }
    else {
      pJStack_20->i = pParent._4_4_ + i + local_30;
    }
    while( true ) {
      bVar3 = false;
      if (pJStack_20->nParent != 0) {
        bVar3 = pJStack_20->aParent[pJStack_20->nParent - 1].iEnd <= pJStack_20->i;
      }
      if (!bVar3) break;
      pJStack_20->nParent = pJStack_20->nParent - 1;
      (pJStack_20->path).nUsed = (ulong)pJStack_20->aParent[pJStack_20->nParent].nPath;
      sz._2_1_ = '\x01';
    }
    if (sz._2_1_ != '\0') {
      if (pJStack_20->nParent == 0) {
        pJStack_20->eType = '\0';
      }
      else {
        pJStack_20->eType =
             (pJStack_20->sParse).aBlob[pJStack_20->aParent[pJStack_20->nParent - 1].iValue] & 0xf;
      }
    }
  }
  if ((pJStack_20->eType == '\v') && (pJStack_20->nParent != 0)) {
    uVar2 = pJStack_20->nParent - 1;
    pJStack_20->aParent[uVar2].iKey = pJStack_20->aParent[uVar2].iKey + 1;
  }
  pJStack_20->iRowid = pJStack_20->iRowid + 1;
  return n;
}

Assistant:

static int jsonEachNext(sqlite3_vtab_cursor *cur){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  int rc = SQLITE_OK;
  if( p->bRecursive ){
    u8 x;
    u8 levelChange = 0;
    u32 n, sz = 0;
    u32 i = jsonSkipLabel(p);
    x = p->sParse.aBlob[i] & 0x0f;
    n = jsonbPayloadSize(&p->sParse, i, &sz);
    if( x==JSONB_OBJECT || x==JSONB_ARRAY ){
      JsonParent *pParent;
      if( p->nParent>=p->nParentAlloc ){
        JsonParent *pNew;
        u64 nNew;
        nNew = p->nParentAlloc*2 + 3;
        pNew = sqlite3DbRealloc(p->db, p->aParent, sizeof(JsonParent)*nNew);
        if( pNew==0 ) return SQLITE_NOMEM;
        p->nParentAlloc = (u32)nNew;
        p->aParent = pNew;
      }
      levelChange = 1;
      pParent = &p->aParent[p->nParent];
      pParent->iHead = p->i;
      pParent->iValue = i;
      pParent->iEnd = i + n + sz;
      pParent->iKey = -1;
      pParent->nPath = (u32)p->path.nUsed;
      if( p->eType && p->nParent ){
        jsonAppendPathName(p);
        if( p->path.eErr ) rc = SQLITE_NOMEM;
      }
      p->nParent++;
      p->i = i + n;
    }else{
      p->i = i + n + sz;
    }
    while( p->nParent>0 && p->i >= p->aParent[p->nParent-1].iEnd ){
      p->nParent--;
      p->path.nUsed = p->aParent[p->nParent].nPath;
      levelChange = 1;
    }
    if( levelChange ){
      if( p->nParent>0 ){
        JsonParent *pParent = &p->aParent[p->nParent-1];
        u32 iVal = pParent->iValue;
        p->eType = p->sParse.aBlob[iVal] & 0x0f;
      }else{
        p->eType = 0;
      }
    }
  }else{
    u32 n, sz = 0;
    u32 i = jsonSkipLabel(p);
    n = jsonbPayloadSize(&p->sParse, i, &sz);
    p->i = i + n + sz;
  }
  if( p->eType==JSONB_ARRAY && p->nParent ){
    p->aParent[p->nParent-1].iKey++;
  }
  p->iRowid++;
  return rc;
}